

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnImportTag
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index tag_index,Index sig_index)

{
  Module *this_00;
  pointer *__ptr;
  FuncDeclaration *decl;
  __uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_> local_c8;
  undefined1 local_c0 [40];
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  Var local_78;
  
  local_98._M_str = field_name._M_str;
  local_98._M_len = field_name._M_len;
  local_88._M_str = module_name._M_str;
  local_88._M_len = module_name._M_len;
  std::make_unique<wabt::TagImport>();
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)(local_c0._0_8_ + 8),&local_88);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)(local_c0._0_8_ + 0x28),&local_98);
  decl = (FuncDeclaration *)(local_c0._0_8_ + 0x70);
  GetLocation((Location *)(local_c0 + 8),this);
  Var::Var(&local_78,sig_index,(Location *)(local_c0 + 8));
  SetFuncDeclaration(this,decl,&local_78);
  Var::~Var(&local_78);
  this_00 = this->module_;
  GetLocation((Location *)(local_c0 + 8),this);
  std::
  make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::TagImport,std::default_delete<wabt::TagImport>>,wabt::Location>
            ((unique_ptr<wabt::TagImport,_std::default_delete<wabt::TagImport>_> *)&local_c8,
             (Location *)local_c0);
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_c8);
  if (local_c8._M_t.super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>
      .super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>)0x0) {
    (**(code **)(*(long *)local_c8._M_t.
                          super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>
                          .super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl + 8))();
  }
  local_c8._M_t.super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
  super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl =
       (tuple<wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>)
       (_Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>)0x0;
  (this->module_->features_used).exceptions = true;
  if ((long *)local_c0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_c0._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportTag(Index import_index,
                                   std::string_view module_name,
                                   std::string_view field_name,
                                   Index tag_index,
                                   Index sig_index) {
  auto import = std::make_unique<TagImport>();
  import->module_name = module_name;
  import->field_name = field_name;
  SetFuncDeclaration(&import->tag.decl, Var(sig_index, GetLocation()));
  module_->AppendField(
      std::make_unique<ImportModuleField>(std::move(import), GetLocation()));
  module_->features_used.exceptions = true;
  return Result::Ok;
}